

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

wostream * mjs::operator<<(wostream *os,declaration *d)

{
  bool bVar1;
  ulong uVar2;
  syntax_node *psVar3;
  wostream *pwVar4;
  declaration *d_local;
  wostream *os_local;
  
  std::operator<<(os,'{');
  uVar2 = std::__cxx11::wstring::empty();
  if ((uVar2 & 1) == 0) {
    std::operator<<(os,(wstring *)d);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&d->init_);
    if (bVar1) {
      pwVar4 = std::operator<<(os,", ");
      psVar3 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                          (&d->init_)->super_syntax_node;
      operator<<(pwVar4,psVar3);
    }
  }
  else {
    psVar3 = &std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                        (&d->init_)->super_syntax_node;
    operator<<(os,psVar3);
  }
  pwVar4 = std::operator<<(os,'}');
  return pwVar4;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const declaration& d) {
        os << '{';
        if (!d.id_.empty()) {
            os << d.id_;
            if (d.init_) {
                os << ", " << *d.init_;
            }
        } else {
            os << *d.init_;
        }
        return os << '}';
    }